

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3SelectLeaf(Fts3Table *p,char *zTerm,int nTerm,char *zNode,int nNode,sqlite3_int64 *piLeaf,
                  sqlite3_int64 *piLeaf2)

{
  void *pvVar1;
  Fts3Table *p_00;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  void *__s2;
  sqlite3_int64 *psVar8;
  char *pcVar9;
  long *plVar10;
  long *plVar11;
  undefined4 in_register_00000084;
  int *pnLoad;
  sqlite3_int64 *piLeaf_00;
  u64 nBytes;
  int iVar12;
  char *p_01;
  long lVar13;
  bool bVar14;
  sqlite3_int64 iChild;
  int iHeight;
  uint local_8c;
  char *local_88;
  int local_7c;
  void *local_78;
  ulong local_70;
  int local_68;
  int local_64;
  long *local_60;
  char *local_58;
  long *local_50;
  Fts3Table *local_48;
  long *local_40;
  char *local_38;
  
  pnLoad = (int *)CONCAT44(in_register_00000084,nNode);
  iVar4 = (int)*zNode;
  local_60 = piLeaf;
  local_58 = zTerm;
  local_48 = p;
  if (*zNode < '\0') {
    sqlite3Fts3GetVarint32(zNode,&local_64);
    iVar4 = local_64;
  }
  local_64 = iVar4;
  pcVar9 = zNode + nNode;
  iVar4 = sqlite3Fts3GetVarint(zNode,(sqlite_int64 *)&local_88);
  local_38 = zNode;
  iVar5 = sqlite3Fts3GetVarint(zNode + iVar4,(sqlite_int64 *)&local_88);
  p_01 = zNode + iVar4 + iVar5;
  iVar4 = 0x10b;
  if (p_01 <= pcVar9) {
    local_70 = 0;
    local_78 = (void *)0x0;
    nBytes = 0;
    bVar3 = false;
    plVar10 = piLeaf2;
    plVar11 = local_60;
    local_68 = nTerm;
    do {
      pcVar2 = local_38;
      if ((pcVar9 <= p_01) || (plVar11 == (long *)0x0 && plVar10 == (long *)0x0)) {
        if (plVar11 != (long *)0x0) {
          *plVar11 = (long)local_88;
        }
        if (plVar10 != (long *)0x0) {
          *plVar10 = (long)local_88;
        }
        break;
      }
      local_7c = 0;
      if (bVar3) {
        if (*p_01 < '\0') {
          uVar6 = sqlite3Fts3GetVarint32(p_01,&local_7c);
          uVar7 = (ulong)uVar6;
        }
        else {
          uVar7 = 1;
          local_7c = (int)*p_01;
        }
        p_01 = p_01 + uVar7;
      }
      if (*p_01 < '\0') {
        uVar6 = sqlite3Fts3GetVarint32(p_01,(int *)&local_8c);
        uVar7 = (ulong)uVar6;
      }
      else {
        uVar7 = 1;
        local_8c = (int)*p_01;
      }
      p_01 = p_01 + uVar7;
      bVar14 = true;
      if ((((long)p_01 - (long)pcVar2 < (long)local_7c) ||
          (lVar13 = (long)(int)local_8c, lVar13 == 0)) || ((long)pcVar9 - (long)p_01 < lVar13)) {
        local_70 = 0x10b;
      }
      else {
        lVar13 = lVar13 + local_7c;
        __s2 = local_78;
        local_50 = plVar10;
        local_40 = plVar11;
        if ((long)nBytes < lVar13) {
          nBytes = lVar13 * 2;
          iVar4 = sqlite3_initialize();
          pvVar1 = local_78;
          if (iVar4 == 0) {
            __s2 = sqlite3Realloc(local_78,nBytes);
          }
          else {
            __s2 = (void *)0x0;
          }
          bVar14 = __s2 == (void *)0x0;
          local_70 = local_70 & 0xffffffff;
          if (bVar14) {
            local_70 = 7;
            plVar10 = local_50;
            plVar11 = local_40;
            local_78 = pvVar1;
            goto LAB_001c9dab;
          }
        }
        memcpy((void *)((long)local_7c + (long)__s2),p_01,(long)(int)local_8c);
        iVar4 = local_68;
        lVar13 = (long)(int)local_8c;
        iVar12 = local_7c + local_8c;
        iVar5 = local_68;
        if (iVar12 < local_68) {
          iVar5 = iVar12;
        }
        local_78 = __s2;
        iVar5 = memcmp(local_58,__s2,(long)iVar5);
        if (local_40 == (long *)0x0) {
          plVar11 = (long *)0x0;
        }
        else if ((iVar5 < 0) || (plVar11 = local_40, iVar5 == 0 && iVar4 < iVar12)) {
          *local_40 = (long)local_88;
          plVar11 = (long *)0x0;
        }
        plVar10 = local_50;
        if ((local_50 != (long *)0x0) && (iVar5 < 0)) {
          *local_50 = (long)local_88;
          plVar10 = (long *)0x0;
        }
        p_01 = p_01 + lVar13;
        local_88 = local_88 + 1;
        bVar14 = false;
      }
LAB_001c9dab:
      bVar3 = true;
    } while (!bVar14);
    sqlite3_free(local_78);
    iVar4 = (int)local_70;
    nTerm = local_68;
  }
  p_00 = local_48;
  if ((iVar4 == 0) && (1 < local_64)) {
    local_88 = (char *)0x0;
    local_8c = 0;
    iVar4 = 0;
    piLeaf_00 = local_60;
    if ((piLeaf2 != (sqlite3_int64 *)0x0 && local_60 != (long *)0x0) && (*local_60 != *piLeaf2)) {
      iVar4 = sqlite3Fts3ReadBlock(local_48,*local_60,&local_88,(int *)&local_8c,pnLoad);
      if (iVar4 == 0) {
        pnLoad = (int *)(ulong)local_8c;
        iVar4 = fts3SelectLeaf(p_00,local_58,nTerm,local_88,local_8c,local_60,(sqlite3_int64 *)0x0);
      }
      sqlite3_free(local_88);
      piLeaf_00 = (sqlite3_int64 *)0x0;
    }
    local_88 = (char *)0x0;
    if (iVar4 == 0) {
      psVar8 = piLeaf_00;
      if (piLeaf_00 == (sqlite3_int64 *)0x0) {
        psVar8 = piLeaf2;
      }
      iVar4 = sqlite3Fts3ReadBlock(p_00,*psVar8,&local_88,(int *)&local_8c,pnLoad);
    }
    if (iVar4 == 0) {
      iVar4 = fts3SelectLeaf(p_00,local_58,nTerm,local_88,local_8c,piLeaf_00,piLeaf2);
    }
    sqlite3_free(local_88);
  }
  return iVar4;
}

Assistant:

static int fts3SelectLeaf(
  Fts3Table *p,                   /* Virtual table handle */
  const char *zTerm,              /* Term to select leaves for */
  int nTerm,                      /* Size of term zTerm in bytes */
  const char *zNode,              /* Buffer containing segment interior node */
  int nNode,                      /* Size of buffer at zNode */
  sqlite3_int64 *piLeaf,          /* Selected leaf node */
  sqlite3_int64 *piLeaf2          /* Selected leaf node */
){
  int rc = SQLITE_OK;             /* Return code */
  int iHeight;                    /* Height of this node in tree */

  assert( piLeaf || piLeaf2 );

  fts3GetVarint32(zNode, &iHeight);
  rc = fts3ScanInteriorNode(zTerm, nTerm, zNode, nNode, piLeaf, piLeaf2);
  assert( !piLeaf2 || !piLeaf || rc!=SQLITE_OK || (*piLeaf<=*piLeaf2) );

  if( rc==SQLITE_OK && iHeight>1 ){
    char *zBlob = 0;              /* Blob read from %_segments table */
    int nBlob = 0;                /* Size of zBlob in bytes */

    if( piLeaf && piLeaf2 && (*piLeaf!=*piLeaf2) ){
      rc = sqlite3Fts3ReadBlock(p, *piLeaf, &zBlob, &nBlob, 0);
      if( rc==SQLITE_OK ){
        rc = fts3SelectLeaf(p, zTerm, nTerm, zBlob, nBlob, piLeaf, 0);
      }
      sqlite3_free(zBlob);
      piLeaf = 0;
      zBlob = 0;
    }

    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3ReadBlock(p, piLeaf?*piLeaf:*piLeaf2, &zBlob, &nBlob, 0);
    }
    if( rc==SQLITE_OK ){
      rc = fts3SelectLeaf(p, zTerm, nTerm, zBlob, nBlob, piLeaf, piLeaf2);
    }
    sqlite3_free(zBlob);
  }

  return rc;
}